

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::clara::detail::Help::Help(Help *this,bool *showHelpFlag)

{
  Opt *this_00;
  anon_class_8_1_beab0a68_for_m_lambda *in_RDI;
  long in_FS_OFFSET;
  string *in_stack_fffffffffffffef8;
  Opt *in_stack_ffffffffffffff00;
  Opt *in_stack_ffffffffffffff40;
  allocator *paVar1;
  allocator local_b7;
  allocator local_b6;
  allocator local_b5 [20];
  allocator local_a1 [25];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Opt::Opt<Catch::clara::detail::Help::Help(bool&)::_lambda(bool)_1_>
            (in_stack_ffffffffffffff40,in_RDI);
  in_RDI->showHelpFlag = (bool *)&PTR__Help_00353628;
  paVar1 = local_a1;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_28,"display usage information",paVar1);
  ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffff00->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_fffffffffffffef8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_48,"-?",local_b5);
  Opt::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_68,"-h",&local_b6);
  Opt::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_88,"--help",&local_b7);
  this_00 = Opt::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  ParserRefImpl<Catch::clara::detail::Opt>::optional
            (&this_00->super_ParserRefImpl<Catch::clara::detail::Opt>);
  ::std::__cxx11::string::~string(local_88);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_b7);
  ::std::__cxx11::string::~string(local_68);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_b6);
  ::std::__cxx11::string::~string(local_48);
  ::std::allocator<char>::~allocator((allocator<char> *)local_b5);
  ::std::__cxx11::string::~string(local_28);
  ::std::allocator<char>::~allocator((allocator<char> *)local_a1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Help( bool &showHelpFlag )
        :   Opt([&]( bool flag ) {
                showHelpFlag = flag;
                return ParserResult::ok( ParseResultType::ShortCircuitAll );
            })
        {
            static_cast<Opt &>( *this )
                    ("display usage information")
                    ["-?"]["-h"]["--help"]
                    .optional();
        }